

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

int Sle_ManCutHasPisOnly(int *pCut,Vec_Bit_t *vMask)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if ((*pCut & 0xf) <= uVar2) {
      return 1;
    }
    iVar1 = Vec_BitEntry(vMask,pCut[uVar2 + 1]);
    uVar2 = uVar2 + 1;
  } while (iVar1 == 0);
  return 0;
}

Assistant:

int Sle_ManCutHasPisOnly( int * pCut, Vec_Bit_t * vMask )
{
    int k, * pC = Sle_CutLeaves(pCut);
    for ( k = 0; k < Sle_CutSize(pCut); k++ )
        if ( Vec_BitEntry(vMask, pC[k]) ) // internal node
            return 0;
    return 1;
}